

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_context_post_error
                    (ma_context *pContext,ma_device *pDevice,ma_uint32 logLevel,char *message,
                    ma_result resultCode)

{
  ma_result resultCode_local;
  char *message_local;
  ma_uint32 logLevel_local;
  ma_device *pDevice_local;
  ma_context *pContext_local;
  
  pDevice_local = (ma_device *)pContext;
  if ((pContext == (ma_context *)0x0) && (pDevice != (ma_device *)0x0)) {
    pDevice_local = (ma_device *)pDevice->pContext;
  }
  ma_post_log_message((ma_context *)pDevice_local,pDevice,logLevel,message);
  return resultCode;
}

Assistant:

static ma_result ma_context_post_error(ma_context* pContext, ma_device* pDevice, ma_uint32 logLevel, const char* message, ma_result resultCode)
{
    /* Derive the context from the device if necessary. */
    if (pContext == NULL) {
        if (pDevice != NULL) {
            pContext = pDevice->pContext;
        }
    }

    ma_post_log_message(pContext, pDevice, logLevel, message);
    return resultCode;
}